

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O2

void __thiscall QTextHtmlParser::parseTag(QTextHtmlParser *this)

{
  char16_t cVar1;
  long lVar2;
  char16_t *pcVar3;
  int iVar4;
  QStringView element;
  bool bVar5;
  iterator iVar6;
  QTextHtmlParserNode *pQVar7;
  QTextHtmlElement *pQVar8;
  QTextHTMLElements QVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long in_FS_OFFSET;
  Data *in_stack_fffffffffffffef8;
  Data *pDVar14;
  StyleRule *pSStack_100;
  qsizetype local_f8;
  Parser parser;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  eatSpace(this);
  if (this->pos < this->len) {
    cVar1 = (this->txt).d.ptr[this->pos];
    if (cVar1 == L'/') {
      iVar6 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
      if (iVar6.i[-1]->id == Html_style) {
        parser.sourcePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        parser.sourcePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        parser._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        parser.sourcePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        parser.symbols.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        parser._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        parser.symbols.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        parser.symbols.d.ptr = (Symbol *)&DAT_aaaaaaaaaaaaaaaa;
        QCss::Parser::Parser(&parser,&(this->nodes).d.ptr[(this->nodes).d.size + -1]->text,false);
        memset(&stack0xfffffffffffffef8,0,0xa0);
        QCss::Parser::parse(&parser,(StyleSheet *)&stack0xfffffffffffffef8,CaseInsensitive);
        QList<QCss::StyleSheet>::emplaceBack<QCss::StyleSheet_const&>
                  (&this->inlineStyleSheets,(StyleSheet *)&stack0xfffffffffffffef8);
        resolveStyleSheetImports(this,(StyleSheet *)&stack0xfffffffffffffef8);
        QCss::StyleSheet::~StyleSheet((StyleSheet *)&stack0xfffffffffffffef8);
        QCss::Parser::~Parser(&parser);
      }
      parseCloseTag(this);
    }
    else {
      if (cVar1 != L'!') goto LAB_00495083;
      parseExclamationTag(this);
      iVar6 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
      if (((iVar6.i[-1]->wsm != WhiteSpacePre) &&
          (iVar6 = QList<QTextHtmlParserNode_*>::end(&this->nodes),
          iVar6.i[-1]->wsm != WhiteSpacePreWrap)) && (this->textEditMode == false)) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          eatSpace(this);
          return;
        }
        goto LAB_00495369;
      }
    }
  }
  else {
LAB_00495083:
    iVar11 = (int)(this->nodes).d.size + -1;
    while ((iVar11 != 0 && (pQVar7 = (this->nodes).d.ptr[iVar11], (pQVar7->tag).d.size == 0))) {
      iVar11 = pQVar7->parent;
    }
    pQVar7 = newNode(this,iVar11);
    parseWord((QString *)&parser,this);
    QString::toLower_helper((QString *)&stack0xfffffffffffffef8);
    pDVar14 = (pQVar7->tag).d.d;
    (pQVar7->tag).d.d = in_stack_fffffffffffffef8;
    (pQVar7->tag).d.ptr = (char16_t *)pSStack_100;
    (pQVar7->tag).d.size = local_f8;
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xfffffffffffffef8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&parser);
    element.m_data = (storage_type_conflict *)pDVar14;
    element.m_size = 0x495117;
    pQVar8 = lookupElementHelper(element);
    if (pQVar8 == (QTextHtmlElement *)0x0) {
      QVar9 = Html_unknown;
    }
    else {
      QVar9 = pQVar8->id;
      *(ushort *)&pQVar7->field_0x90 =
           (ushort)*(undefined4 *)&pQVar7->field_0x90 & 0xf1ff |
           (ushort)((pQVar8->displayMode & 7) << 9);
    }
    pQVar7->id = QVar9;
    QList<QString>::clear(&pQVar7->attributes);
    if ((this->pos < this->len) &&
       (bVar5 = QChar::isSpace((uint)(ushort)(this->txt).d.ptr[this->pos]), bVar5)) {
      parseAttributes((QStringList *)&stack0xfffffffffffffef8,this);
      QArrayDataPointer<QString>::operator=
                (&(pQVar7->attributes).d,(QArrayDataPointer<QString> *)&stack0xfffffffffffffef8);
      QArrayDataPointer<QString>::~QArrayDataPointer
                ((QArrayDataPointer<QString> *)&stack0xfffffffffffffef8);
    }
    pQVar7 = resolveParent(this);
    resolveNode(this);
    declarationsForNode((QList<QCss::Declaration> *)&stack0xfffffffffffffef8,this,
                        (int)(this->nodes).d.size + -1);
    QTextHtmlParserNode::applyCssDeclarations
              (pQVar7,(QList<QCss::Declaration> *)&stack0xfffffffffffffef8,this->resourceProvider);
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer
              ((QArrayDataPointer<QCss::Declaration> *)&stack0xfffffffffffffef8);
    applyAttributes(this,&pQVar7->attributes);
    iVar11 = this->len;
    iVar12 = this->pos;
    pcVar3 = (this->txt).d.ptr;
    lVar13 = (long)iVar12;
    iVar4 = iVar11;
    if (iVar11 < iVar12) {
      iVar4 = iVar12;
    }
    bVar5 = false;
    for (; (iVar10 = iVar4, lVar13 < iVar11 &&
           (cVar1 = pcVar3[lVar13], iVar10 = iVar12, cVar1 != L'>')); lVar13 = lVar13 + 1) {
      bVar5 = (bool)(bVar5 | cVar1 == L'/');
      iVar12 = iVar12 + 1;
      this->pos = iVar12;
    }
    iVar12 = iVar10 + 1;
    this->pos = iVar12;
    if (((((uint)pQVar7->wsm < 5) && ((0x1aU >> (pQVar7->wsm & 0x1f) & 1) != 0)) &&
        ((pQVar7->field_0x91 & 0xe) == 0)) && ((iVar12 < iVar11 + -1 && (pcVar3[iVar12] == L'\n'))))
    {
      this->pos = iVar10 + 2;
    }
    if ((((ulong)(uint)pQVar7->id < 0x39) &&
        ((0x1000000e0000000U >> ((ulong)(uint)pQVar7->id & 0x3f) & 1) != 0)) || (bVar5)) {
      newNode(this,pQVar7->parent);
      resolveNode(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00495369:
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::parseTag()
{
    eatSpace();

    // handle comments and other exclamation mark declarations
    if (hasPrefix(u'!')) {
        parseExclamationTag();
        if (nodes.last()->wsm != QTextHtmlParserNode::WhiteSpacePre
            && nodes.last()->wsm != QTextHtmlParserNode::WhiteSpacePreWrap
                && !textEditMode)
            eatSpace();
        return;
    }

    // if close tag just close
    if (hasPrefix(u'/')) {
        if (nodes.last()->id == Html_style) {
#ifndef QT_NO_CSSPARSER
            QCss::Parser parser(nodes.constLast()->text);
            QCss::StyleSheet sheet;
            sheet.origin = QCss::StyleSheetOrigin_Author;
            parser.parse(&sheet, Qt::CaseInsensitive);
            inlineStyleSheets.append(sheet);
            resolveStyleSheetImports(sheet);
#endif
        }
        parseCloseTag();
        return;
    }

    int p = last();
    while (p && at(p).tag.size() == 0)
        p = at(p).parent;

    QTextHtmlParserNode *node = newNode(p);

    // parse tag name
    node->tag = parseWord().toLower();

    const QTextHtmlElement *elem = lookupElementHelper(node->tag);
    if (elem) {
        node->id = elem->id;
        node->displayMode = elem->displayMode;
    } else {
        node->id = Html_unknown;
    }

    node->attributes.clear();
    // _need_ at least one space after the tag name, otherwise there can't be attributes
    if (pos < len && txt.at(pos).isSpace())
        node->attributes = parseAttributes();

    // resolveParent() may have to change the order in the tree and
    // insert intermediate nodes for buggy HTML, so re-initialize the 'node'
    // pointer through the return value
    node = resolveParent();
    resolveNode();

#ifndef QT_NO_CSSPARSER
    const int nodeIndex = nodes.size() - 1; // this new node is always the last
    node->applyCssDeclarations(declarationsForNode(nodeIndex), resourceProvider);
#endif
    applyAttributes(node->attributes);

    // finish tag
    bool tagClosed = false;
    while (pos < len && txt.at(pos) != u'>') {
        if (txt.at(pos) == u'/')
            tagClosed = true;

        pos++;
    }
    pos++;

    // in a white-space preserving environment strip off a initial newline
    // since the element itself already generates a newline
    if ((node->wsm == QTextHtmlParserNode::WhiteSpacePre
         || node->wsm == QTextHtmlParserNode::WhiteSpacePreWrap
         || node->wsm == QTextHtmlParserNode::WhiteSpacePreLine)
        && node->isBlock()) {
        if (pos < len - 1 && txt.at(pos) == u'\n')
            ++pos;
    }

    if (node->mayNotHaveChildren() || tagClosed) {
        newNode(node->parent);
        resolveNode();
    }
}